

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsExtensions
               (Descriptor *message)

{
  bool bVar1;
  ulong uVar2;
  Descriptor *message_00;
  ulong uVar3;
  
  bVar1 = true;
  if (*(int *)(message + 0x78) < 1) {
    uVar3 = (ulong)*(int *)(message + 0x48);
    if ((long)uVar3 < 1) {
      bVar1 = false;
    }
    else {
      message_00 = *(Descriptor **)(message + 0x50);
      uVar2 = 0;
      do {
        bVar1 = MessageContainsExtensions(message_00);
        if (bVar1) {
          return true;
        }
        uVar2 = uVar2 + 1;
        message_00 = message_00 + 0xa8;
      } while (uVar3 != uVar2);
      bVar1 = uVar2 < uVar3;
    }
  }
  return bVar1;
}

Assistant:

bool MessageContainsExtensions(const Descriptor* message) {
  if (message->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsExtensions(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}